

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse4.c
# Opt level: O2

int aom_vector_var_sse4_1(int16_t *ref,int16_t *src,int bwl)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  long lVar4;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar5 [16];
  short sVar12;
  int iVar14;
  int iVar15;
  undefined1 auVar13 [16];
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  auVar5 = (undefined1  [16])0x0;
  auVar13 = (undefined1  [16])0x0;
  for (lVar4 = 0; (int)lVar4 < 4 << ((byte)bwl & 0x1f); lVar4 = lVar4 + 0x10) {
    psVar1 = src + lVar4;
    psVar3 = src + lVar4 + 8;
    psVar2 = ref + lVar4;
    auVar19._0_2_ = *psVar2 - *psVar1;
    auVar19._2_2_ = psVar2[1] - psVar1[1];
    auVar19._4_2_ = psVar2[2] - psVar1[2];
    auVar19._6_2_ = psVar2[3] - psVar1[3];
    auVar19._8_2_ = psVar2[4] - psVar1[4];
    auVar19._10_2_ = psVar2[5] - psVar1[5];
    auVar19._12_2_ = psVar2[6] - psVar1[6];
    auVar19._14_2_ = psVar2[7] - psVar1[7];
    psVar1 = ref + lVar4 + 8;
    auVar17._0_2_ = *psVar1 - *psVar3;
    auVar17._2_2_ = psVar1[1] - psVar3[1];
    auVar17._4_2_ = psVar1[2] - psVar3[2];
    auVar17._6_2_ = psVar1[3] - psVar3[3];
    auVar17._8_2_ = psVar1[4] - psVar3[4];
    auVar17._10_2_ = psVar1[5] - psVar3[5];
    auVar17._12_2_ = psVar1[6] - psVar3[6];
    auVar17._14_2_ = psVar1[7] - psVar3[7];
    auVar18 = pmaddwd(auVar19,auVar19);
    sVar6 = auVar5._2_2_;
    sVar7 = auVar5._4_2_;
    sVar8 = auVar5._6_2_;
    sVar9 = auVar5._8_2_;
    sVar10 = auVar5._10_2_;
    sVar11 = auVar5._12_2_;
    sVar12 = auVar5._14_2_;
    auVar5._0_2_ = auVar19._0_2_ + auVar5._0_2_ + auVar17._0_2_;
    auVar5._2_2_ = auVar19._2_2_ + sVar6 + auVar17._2_2_;
    auVar5._4_2_ = auVar19._4_2_ + sVar7 + auVar17._4_2_;
    auVar5._6_2_ = auVar19._6_2_ + sVar8 + auVar17._6_2_;
    auVar5._8_2_ = auVar19._8_2_ + sVar9 + auVar17._8_2_;
    auVar5._10_2_ = auVar19._10_2_ + sVar10 + auVar17._10_2_;
    auVar5._12_2_ = auVar19._12_2_ + sVar11 + auVar17._12_2_;
    auVar5._14_2_ = auVar19._14_2_ + sVar12 + auVar17._14_2_;
    auVar17 = pmaddwd(auVar17,auVar17);
    iVar14 = auVar13._4_4_;
    iVar15 = auVar13._8_4_;
    iVar16 = auVar13._12_4_;
    auVar13._0_4_ = auVar18._0_4_ + auVar13._0_4_ + auVar17._0_4_;
    auVar13._4_4_ = auVar18._4_4_ + iVar14 + auVar17._4_4_;
    auVar13._8_4_ = auVar18._8_4_ + iVar15 + auVar17._8_4_;
    auVar13._12_4_ = auVar18._12_4_ + iVar16 + auVar17._12_4_;
  }
  auVar5 = pmaddwd(auVar5,_DAT_0046b0f0);
  auVar5 = phaddd(auVar5,auVar13);
  auVar5 = phaddd(auVar5,auVar5);
  return auVar5._12_4_ - ((uint)(auVar5._0_4_ * auVar5._0_4_) >> ((byte)bwl + 2 & 0x1f));
}

Assistant:

int aom_vector_var_sse4_1(const int16_t *ref, const int16_t *src, int bwl) {
  const int width = 4 << bwl;
  assert(width % 16 == 0);

  const __m128i k_one_epi16 = _mm_set1_epi16((int16_t)1);
  __m128i mean = _mm_setzero_si128();
  __m128i sse = _mm_setzero_si128();

  for (int i = 0; i < width; i += 16) {
    const __m128i src_line = _mm_loadu_si128((const __m128i *)src);
    const __m128i ref_line = _mm_loadu_si128((const __m128i *)ref);
    const __m128i src_line2 = _mm_loadu_si128((const __m128i *)(src + 8));
    const __m128i ref_line2 = _mm_loadu_si128((const __m128i *)(ref + 8));
    __m128i diff = _mm_sub_epi16(ref_line, src_line);
    const __m128i diff2 = _mm_sub_epi16(ref_line2, src_line2);
    __m128i diff_sqr = _mm_madd_epi16(diff, diff);
    const __m128i diff_sqr2 = _mm_madd_epi16(diff2, diff2);

    diff = _mm_add_epi16(diff, diff2);
    diff_sqr = _mm_add_epi32(diff_sqr, diff_sqr2);
    sse = _mm_add_epi32(sse, diff_sqr);
    mean = _mm_add_epi16(mean, diff);

    src += 16;
    ref += 16;
  }

  // m0 m1 m2 m3
  mean = _mm_madd_epi16(mean, k_one_epi16);
  // m0+m1 m2+m3 s0+s1 s2+s3
  __m128i result = _mm_hadd_epi32(mean, sse);
  // m0+m1+m2+m3 s0+s1+s2+s3 x x
  result = _mm_add_epi32(result, _mm_bsrli_si128(result, 4));

  // (mean * mean): dynamic range 31 bits.
  const int mean_int = _mm_extract_epi32(result, 0);
  const int sse_int = _mm_extract_epi32(result, 2);
  const unsigned int mean_abs = abs(mean_int);
  const int var = sse_int - ((mean_abs * mean_abs) >> (bwl + 2));
  return var;
}